

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_psnr_enc.c
# Opt level: O2

int WebPPictureDistortion(WebPPicture *src,WebPPicture *ref,int type,float *results)

{
  int height;
  int iVar1;
  int iVar2;
  int iVar3;
  float *result;
  long lVar4;
  double dVar5;
  double size;
  float distortion;
  double local_248;
  double local_240;
  double local_238;
  WebPPicture p1;
  WebPPicture p0;
  
  if (ref == (WebPPicture *)0x0 || src == (WebPPicture *)0x0) {
    return 0;
  }
  if (src->width != ref->width) {
    return 0;
  }
  if (results == (float *)0x0) {
    return 0;
  }
  if (src->height != ref->height) {
    return 0;
  }
  VP8SSIMDspInit();
  iVar1 = WebPPictureInit(&p0);
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = WebPPictureInit(&p1);
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = src->width;
  height = src->height;
  iVar2 = WebPPictureView(src,0,0,iVar1,height,&p0);
  iVar3 = 0;
  if (iVar2 != 0) {
    iVar2 = WebPPictureView(ref,0,0,iVar1,height,&p1);
    iVar3 = 0;
    if (((iVar2 != 0) && ((p0.use_argb != 0 || (iVar2 = WebPPictureYUVAToARGB(&p0), iVar2 != 0))))
       && ((p1.use_argb != 0 || (iVar2 = WebPPictureYUVAToARGB(&p1), iVar3 = 0, iVar2 != 0)))) {
      local_248 = (double)(height * iVar1);
      size = 0.0;
      dVar5 = 0.0;
      result = results;
      for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
        local_240 = dVar5;
        local_238 = size;
        iVar3 = WebPPlaneDistortion((uint8_t *)((long)p0.argb + lVar4),(long)p0.argb_stride << 2,
                                    (uint8_t *)((long)p1.argb + lVar4),(long)p1.argb_stride << 2,
                                    iVar1,height,4,type,&distortion,result);
        if (iVar3 == 0) {
          iVar3 = 0;
          goto LAB_00120dd1;
        }
        dVar5 = local_240 + (double)distortion;
        size = local_238 + local_248;
        result = result + 1;
      }
      if (type == 1) {
        dVar5 = GetLogSSIM(dVar5,size);
      }
      else {
        dVar5 = GetPSNR(dVar5,size);
      }
      results[4] = (float)dVar5;
      iVar3 = 1;
    }
  }
LAB_00120dd1:
  WebPPictureFree(&p0);
  WebPPictureFree(&p1);
  return iVar3;
}

Assistant:

int WebPPictureDistortion(const WebPPicture* src, const WebPPicture* ref,
                          int type, float results[5]) {
  int w, h, c;
  int ok = 0;
  WebPPicture p0, p1;
  double total_size = 0., total_distortion = 0.;
  if (src == NULL || ref == NULL ||
      src->width != ref->width || src->height != ref->height ||
      results == NULL) {
    return 0;
  }

  VP8SSIMDspInit();
  if (!WebPPictureInit(&p0) || !WebPPictureInit(&p1)) return 0;
  w = src->width;
  h = src->height;
  if (!WebPPictureView(src, 0, 0, w, h, &p0)) goto Error;
  if (!WebPPictureView(ref, 0, 0, w, h, &p1)) goto Error;

  // We always measure distortion in ARGB space.
  if (p0.use_argb == 0 && !WebPPictureYUVAToARGB(&p0)) goto Error;
  if (p1.use_argb == 0 && !WebPPictureYUVAToARGB(&p1)) goto Error;
  for (c = 0; c < 4; ++c) {
    float distortion;
    const size_t stride0 = 4 * (size_t)p0.argb_stride;
    const size_t stride1 = 4 * (size_t)p1.argb_stride;
    // results are reported as BGRA
    const int offset = c ^ BLUE_OFFSET;
    if (!WebPPlaneDistortion((const uint8_t*)p0.argb + offset, stride0,
                             (const uint8_t*)p1.argb + offset, stride1,
                             w, h, 4, type, &distortion, results + c)) {
      goto Error;
    }
    total_distortion += distortion;
    total_size += w * h;
  }

  results[4] = (type == 1) ? (float)GetLogSSIM(total_distortion, total_size)
                           : (float)GetPSNR(total_distortion, total_size);
  ok = 1;

 Error:
  WebPPictureFree(&p0);
  WebPPictureFree(&p1);
  return ok;
}